

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O3

RSA * RSAPublicKey_dup(RSA *rsa)

{
  int iVar1;
  RSA *pRVar2;
  uint8_t *der;
  size_t der_len;
  uint8_t *local_18;
  size_t local_10;
  
  iVar1 = RSA_public_key_to_bytes(&local_18,&local_10,(RSA *)rsa);
  if (iVar1 == 0) {
    pRVar2 = (RSA *)0x0;
  }
  else {
    pRVar2 = RSA_public_key_from_bytes(local_18,local_10);
    OPENSSL_free(local_18);
  }
  return (RSA *)pRVar2;
}

Assistant:

RSA *RSAPublicKey_dup(const RSA *rsa) {
  uint8_t *der;
  size_t der_len;
  if (!RSA_public_key_to_bytes(&der, &der_len, rsa)) {
    return NULL;
  }
  RSA *ret = RSA_public_key_from_bytes(der, der_len);
  OPENSSL_free(der);
  return ret;
}